

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::DetectSnapshotChainstate(ChainstateManager *this)

{
  long lVar1;
  bool bVar2;
  uint256 *puVar3;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  optional<uint256> base_blockhash;
  optional<fs::path> path;
  optional<fs::path> *in_stack_fffffffffffffea8;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  path *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte bVar5;
  int in_stack_ffffffffffffff1c;
  ChainstateManager *in_stack_ffffffffffffff30;
  ConstevalFormatString<1U> in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff70;
  path *in_stack_ffffffffffffff88;
  array<unsigned_char,_32UL> in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     in_stack_fffffffffffffea8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_snapshot_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1877,"bool ChainstateManager::DetectSnapshotChainstate()");
  }
  ::node::FindSnapshotChainstateDir
            ((path *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  bVar2 = std::optional::operator_cast_to_bool(in_stack_fffffffffffffea8);
  if (bVar2) {
    std::optional<fs::path>::operator*(in_stack_fffffffffffffea8);
    fs::path::path((path *)in_stack_fffffffffffffea8,(path *)0x7f1e3a);
    ::node::ReadSnapshotBaseBlockhash(in_stack_ffffffffffffff88);
    fs::path::~path((path *)in_stack_fffffffffffffea8);
    bVar2 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffffea8);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::optional<fs::path>::operator*(in_stack_fffffffffffffea8);
      uVar4 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      fs::PathToString_abi_cxx11_(in_stack_fffffffffffffeb0);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uVar4,2);
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,in_stack_ffffffffffffff1c,
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),in_stack_00000050,
                 in_stack_ffffffffffffff58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::__cxx11::string::~string(this_00);
      puVar3 = std::optional<uint256>::operator*((optional<uint256> *)this_00);
      in_stack_fffffffffffffea8 =
           *(optional<fs::path> **)(puVar3->super_base_blob<256U>).m_data._M_elems;
      ActivateExistingSnapshot
                (in_stack_ffffffffffffff30,(uint256)in_stack_ffffffffffffffa0._M_elems);
      bVar5 = 1;
    }
    else {
      bVar5 = 0;
    }
  }
  else {
    bVar5 = 0;
  }
  std::optional<fs::path>::~optional(in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::DetectSnapshotChainstate()
{
    assert(!m_snapshot_chainstate);
    std::optional<fs::path> path = node::FindSnapshotChainstateDir(m_options.datadir);
    if (!path) {
        return false;
    }
    std::optional<uint256> base_blockhash = node::ReadSnapshotBaseBlockhash(*path);
    if (!base_blockhash) {
        return false;
    }
    LogPrintf("[snapshot] detected active snapshot chainstate (%s) - loading\n",
        fs::PathToString(*path));

    this->ActivateExistingSnapshot(*base_blockhash);
    return true;
}